

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void AddAttrToList(AttVal **list,AttVal *av)

{
  AttVal *local_20;
  AttVal *here;
  AttVal *av_local;
  AttVal **list_local;
  
  if (*list == (AttVal *)0x0) {
    *list = av;
  }
  else {
    for (local_20 = *list; local_20->next != (AttVal *)0x0; local_20 = local_20->next) {
    }
    local_20->next = av;
  }
  return;
}

Assistant:

static void AddAttrToList( AttVal** list, AttVal* av )
{
  if ( *list == NULL )
    *list = av;
  else
  {
    AttVal* here = *list;
    while ( here->next )
      here = here->next;
    here->next = av;
  }
}